

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O1

bool testUVProcessChainExternalLoop(char *helperCommand)

{
  bool bVar1;
  int iVar2;
  cmUVProcessChainBuilder *pcVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  long *plVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  cmUVProcessChain chain;
  uv_loop_ptr loop;
  string output;
  cmUVProcessChainBuilder builder;
  cmUVPipeIStream stream;
  undefined1 auStack_268 [16];
  uv_loop_ptr local_258;
  undefined1 local_248 [32];
  cmUVProcessChainBuilder local_228;
  undefined1 local_1c8 [32];
  long *local_1a8 [2];
  long local_198 [11];
  uv_handle_ptr_base_<uv_pipe_s> local_140;
  undefined8 local_130 [33];
  
  local_258.loop.super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258.loop.super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cm::uv_loop_ptr::init(&local_258,(EVP_PKEY_CTX *)0x0);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,helperCommand,(allocator<char> *)auStack_268);
  plVar9 = local_198;
  local_1a8[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"echo","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_248,__l,(allocator_type *)(auStack_268 + 0xf));
  pcVar3 = cmUVProcessChainBuilder::AddCommand
                     (&local_228,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_248);
  pcVar3 = cmUVProcessChainBuilder::SetBuiltinStream(pcVar3,Stream_OUTPUT);
  puVar4 = cm::uv_loop_ptr::operator*(&local_258);
  cmUVProcessChainBuilder::SetExternalLoop(pcVar3,puVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_248);
  lVar7 = -0x40;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  puVar4 = cmUVProcessChainBuilder::GetLoop(&local_228);
  puVar5 = cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&local_258);
  if (puVar4 != puVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GetLoop() should return external loop",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    bVar1 = false;
    goto LAB_001e1a46;
  }
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)auStack_268);
  puVar4 = cmUVProcessChain::GetLoop((cmUVProcessChain *)auStack_268);
  puVar5 = cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&local_258);
  if (puVar4 == puVar5) {
    bVar1 = cmUVProcessChain::Wait((cmUVProcessChain *)auStack_268,0);
    if (!bVar1) {
      lVar7 = 0x10;
      pcVar8 = "Wait() timed out";
      goto LAB_001e1a02;
    }
    puVar4 = cmUVProcessChain::GetLoop((cmUVProcessChain *)auStack_268);
    iVar2 = cmUVProcessChain::OutputStream((cmUVProcessChain *)auStack_268);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)local_1c8,puVar4,iVar2);
    getInput_abi_cxx11_((string *)local_248,(istream *)local_1c8);
    iVar2 = std::__cxx11::string::compare(local_248);
    bVar1 = iVar2 == 0;
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Output was \"",0xc);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_248._0_8_,local_248._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\", expected \"HELLO world!\"",0x1a);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    local_1c8._0_8_ = cmBasicUVPipeIStream<char,std::char_traits<char>>::vtable + 0x18;
    local_130[0] = 0xbd7b10;
    cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_140);
    local_1c8._0_8_ =
         cmBasicUVIStream<char,std::char_traits<char>>-in-cmBasicUVPipeIStream<char,std::char_traits<char>>
         ::construction_vtable + 0x18;
    local_130[0] = 0xbd7b90;
    cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf
              ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)(local_1c8 + 0x10));
    local_1c8._0_8_ =
         std::istream-in-cmBasicUVPipeIStream<char,std::char_traits<char>>::construction_vtable +
         0x18;
    local_130[0] = 0xbd7bf8;
    local_1c8._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)local_130);
  }
  else {
    lVar7 = 0x25;
    pcVar8 = "GetLoop() should return external loop";
LAB_001e1a02:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    bVar1 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)auStack_268);
LAB_001e1a46:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.WorkingDirectory._M_dataplus._M_p != &local_228.WorkingDirectory.field_2) {
    operator_delete(local_228.WorkingDirectory._M_dataplus._M_p,
                    local_228.WorkingDirectory.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_228.Processes);
  cm::uv_loop_ptr::~uv_loop_ptr(&local_258);
  return bVar1;
}

Assistant:

bool testUVProcessChainExternalLoop(const char* helperCommand)
{
  cm::uv_loop_ptr loop;
  loop.init();

  cmUVProcessChainBuilder builder;
  builder.AddCommand({ helperCommand, "echo" })
    .SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .SetExternalLoop(*loop);
  if (builder.GetLoop() != loop) {
    std::cout << "GetLoop() should return external loop" << std::endl;
    return false;
  }

  auto chain = builder.Start();

  if (&chain.GetLoop() != loop) {
    std::cout << "GetLoop() should return external loop" << std::endl;
    return false;
  }

  if (!chain.Wait()) {
    std::cout << "Wait() timed out" << std::endl;
    return false;
  }

  cmUVPipeIStream stream(chain.GetLoop(), chain.OutputStream());
  std::string output = getInput(stream);
  if (output != "HELLO world!") {
    std::cout << "Output was \"" << output << "\", expected \"HELLO world!\""
              << std::endl;
    return false;
  }

  return true;
}